

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_sig.c
# Opt level: O0

int ecdsa_digest_verify_final(void *vctx,uchar *sig,size_t siglen)

{
  int iVar1;
  long in_RDI;
  uint dlen;
  uchar digest [64];
  PROV_ECDSA_CTX *ctx;
  size_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar2;
  size_t in_stack_ffffffffffffff98;
  uchar *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  int local_4;
  
  uVar2 = 0;
  iVar1 = ossl_prov_is_running();
  if (((iVar1 == 0) || (in_RDI == 0)) || (*(long *)(in_RDI + 0x178) == 0)) {
    local_4 = 0;
  }
  else {
    iVar1 = EVP_DigestFinal_ex(*(EVP_MD_CTX **)(in_RDI + 0x178),&stack0xffffffffffffff98,
                               (uint *)&stack0xffffffffffffff94);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      *(byte *)(in_RDI + 0x4a) = *(byte *)(in_RDI + 0x4a) & 0xfe | 1;
      local_4 = ecdsa_verify(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                             in_stack_ffffffffffffff98,
                             (uchar *)CONCAT44(uVar2,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88);
    }
  }
  return local_4;
}

Assistant:

int ecdsa_digest_verify_final(void *vctx, const unsigned char *sig,
                              size_t siglen)
{
    PROV_ECDSA_CTX *ctx = (PROV_ECDSA_CTX *)vctx;
    unsigned char digest[EVP_MAX_MD_SIZE];
    unsigned int dlen = 0;

    if (!ossl_prov_is_running() || ctx == NULL || ctx->mdctx == NULL)
        return 0;

    if (!EVP_DigestFinal_ex(ctx->mdctx, digest, &dlen))
        return 0;
    ctx->flag_allow_md = 1;
    return ecdsa_verify(ctx, sig, siglen, digest, (size_t)dlen);
}